

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

void ImPlot::PushStyleColor(ImPlotCol idx,ImU32 col)

{
  ImVec4 *pIVar1;
  ImGuiColorMod *__src;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImPlotContext *pIVar6;
  int iVar7;
  ImGuiColorMod *__dest;
  int iVar8;
  int iVar9;
  ImVec4 *pIVar10;
  ImVec4 IVar11;
  
  pIVar6 = GImPlot;
  pIVar10 = (GImPlot->Style).Colors + idx;
  fVar2 = pIVar10->x;
  fVar3 = pIVar10->y;
  pIVar1 = (GImPlot->Style).Colors + idx;
  fVar4 = pIVar1->z;
  fVar5 = pIVar1->w;
  iVar7 = (GImPlot->ColorModifiers).Size;
  if (iVar7 == (GImPlot->ColorModifiers).Capacity) {
    if (iVar7 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar7 / 2 + iVar7;
    }
    iVar9 = iVar7 + 1;
    if (iVar7 + 1 < iVar8) {
      iVar9 = iVar8;
    }
    __dest = (ImGuiColorMod *)ImGui::MemAlloc((long)iVar9 * 0x14);
    __src = (pIVar6->ColorModifiers).Data;
    if (__src != (ImGuiColorMod *)0x0) {
      memcpy(__dest,__src,(long)(pIVar6->ColorModifiers).Size * 0x14);
      ImGui::MemFree((pIVar6->ColorModifiers).Data);
    }
    (pIVar6->ColorModifiers).Data = __dest;
    (pIVar6->ColorModifiers).Capacity = iVar9;
    iVar7 = (pIVar6->ColorModifiers).Size;
  }
  else {
    __dest = (GImPlot->ColorModifiers).Data;
  }
  __dest[iVar7].Col = idx;
  pIVar1 = &__dest[iVar7].BackupValue;
  pIVar1->x = fVar2;
  pIVar1->y = fVar3;
  pIVar1->z = fVar4;
  pIVar1->w = fVar5;
  (pIVar6->ColorModifiers).Size = (pIVar6->ColorModifiers).Size + 1;
  IVar11 = ImGui::ColorConvertU32ToFloat4(col);
  *pIVar10 = IVar11;
  return;
}

Assistant:

void PushStyleColor(ImPlotCol idx, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = gp.Style.Colors[idx];
    gp.ColorModifiers.push_back(backup);
    gp.Style.Colors[idx] = ImGui::ColorConvertU32ToFloat4(col);
}